

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.h
# Opt level: O0

void __thiscall jaegertracing::net::http::Header::~Header(Header *this)

{
  Header *this_local;
  
  std::__cxx11::string::~string((string *)&this->_value);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Header() = default;